

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O0

Sentence * jhu::thrax::tokens<true>(Sentence *__return_storage_ptr__,string_view line)

{
  bool bVar1;
  bool bVar2;
  reference this;
  const_reference pvVar3;
  char *in_RCX;
  string_view line_00;
  basic_string_view<char,_std::char_traits<char>_> *t;
  iterator __end2;
  iterator __begin2;
  Sentence *__range2;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_80;
  const_iterator local_78;
  const_iterator local_70;
  basic_string_view<char,_std::char_traits<char>_> *local_50;
  basic_string_view<char,_std::char_traits<char>_> *local_48;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_40;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  it;
  string_view line_local;
  Sentence *sentence;
  
  line_00._M_len = line._M_str;
  it._M_current = (basic_string_view<char,_std::char_traits<char>_> *)line._M_len;
  line_00._M_str = in_RCX;
  split(__return_storage_ptr__,(thrax *)it._M_current,line_00);
  local_48 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin(__return_storage_ptr__);
  local_50 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end(__return_storage_ptr__);
  local_40 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,jhu::thrax::tokens<true>(std::basic_string_view<char,std::char_traits<char>>)::_lambda(auto:1)_1_>
                       (local_48,local_50);
  __gnu_cxx::
  __normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
  ::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*>
            ((__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
              *)&local_70,&local_40);
  local_80._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::end(__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
  ::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*>
            ((__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
              *)&local_78,&local_80);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::erase(__return_storage_ptr__,local_70,local_78);
  __end2 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin(__return_storage_ptr__);
  t = (basic_string_view<char,_std::char_traits<char>_> *)
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::end(__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                     *)&t), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           ::operator*(&__end2);
    while( true ) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(this);
      bVar1 = false;
      if (!bVar2) {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back(this);
        bVar1 = *pvVar3 == ')';
      }
      if (!bVar1) break;
      std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix(this,1);
    }
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

Sentence tokens(std::string_view line) {
  auto sentence = split(line);
  if constexpr (!IsParsed) {
    return sentence;
  }
  auto it = std::remove_if(
      sentence.begin(),
      sentence.end(),
      [](auto t) { return t.front() == '('; });
  sentence.erase(it, sentence.end());
  for (auto& t : sentence) {
    while (!t.empty() && t.back() == ')') {
      t.remove_suffix(1);
    }
  }
  return sentence;
}